

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

string * lest::to_string(string *__return_storage_ptr__,string *txt)

{
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *txt_local;
  
  local_18 = txt;
  txt_local = __return_storage_ptr__;
  make_tran_string(&local_78,txt);
  std::operator+(&local_58,"\"",&local_78);
  std::operator+(&local_38,&local_58,"\"");
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string( std::string    const & txt ) { return "\"" + make_tran_string(                 txt   ) + "\""; }